

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
               uint8_t maxThreshold)

{
  uint uVar1;
  uint uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  imageException *this;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  ulong uVar8;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_80);
  uVar4 = maxThreshold;
  uVar3 = minThreshold;
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  if (uVar3 <= uVar4) {
    uVar1 = out->_rowSize;
    uVar2 = in->_rowSize;
    puVar6 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
    puVar5 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2);
    puVar7 = puVar6 + height * uVar1;
    for (; puVar6 != puVar7; puVar6 = puVar6 + uVar1) {
      for (uVar8 = 0; width != uVar8; uVar8 = uVar8 + 1) {
        puVar6[uVar8] = -(puVar5[uVar8] <= uVar4 && uVar3 <= puVar5[uVar8]);
      }
      puVar5 = puVar5 + uVar2;
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this,"Minimum threshold value is bigger than maximum threshold value");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );
        OptimiseRoi( width, height, in, out );

        if( minThreshold > maxThreshold )
            throw imageException( "Minimum threshold value is bigger than maximum threshold value" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
        }
    }